

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void ImGui::SetCursorScreenPos(ImVec2 *screen_pos)

{
  ImVec2 IVar1;
  ImGuiWindow *pIVar2;
  ImVec2 IVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->Accessed = true;
  IVar3 = *screen_pos;
  (pIVar2->DC).CursorPos = IVar3;
  IVar1 = (pIVar2->DC).CursorMaxPos;
  fVar6 = IVar1.x;
  fVar7 = IVar1.y;
  uVar4 = -(uint)(IVar3.x <= fVar6);
  uVar5 = -(uint)(IVar3.y <= fVar7);
  (pIVar2->DC).CursorMaxPos =
       (ImVec2)(CONCAT44(~uVar5 & (uint)IVar3.y,~uVar4 & (uint)IVar3.x) |
               CONCAT44((uint)fVar7 & uVar5,(uint)fVar6 & uVar4));
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->Accessed = true; return g.CurrentWindow; }